

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttdriver.c
# Opt level: O2

FT_Error tt_size_select(FT_Size size,FT_ULong strike_index)

{
  FT_Face face;
  int iVar1;
  
  face = size->face;
  size[2].metrics.height = strike_index;
  if ((face->face_flags & 1) == 0) {
    iVar1 = (**(code **)(*(long *)&face[3].units_per_EM + 0xd8))(face,strike_index,&size->metrics);
    if (iVar1 == 0) {
      iVar1 = 0;
    }
    else {
      size[2].metrics.height = 0xffffffff;
    }
  }
  else {
    FT_Select_Metrics(face,strike_index);
    iVar1 = 0;
    tt_size_reset((TT_Size)size,'\0');
  }
  return iVar1;
}

Assistant:

static FT_Error
  tt_size_select( FT_Size   size,
                  FT_ULong  strike_index )
  {
    TT_Face   ttface = (TT_Face)size->face;
    TT_Size   ttsize = (TT_Size)size;
    FT_Error  error  = FT_Err_Ok;


    ttsize->strike_index = strike_index;

    if ( FT_IS_SCALABLE( size->face ) )
    {
      /* use the scaled metrics, even when tt_size_reset fails */
      FT_Select_Metrics( size->face, strike_index );

      tt_size_reset( ttsize, 0 ); /* ignore return value */
    }
    else
    {
      SFNT_Service      sfnt         = (SFNT_Service)ttface->sfnt;
      FT_Size_Metrics*  size_metrics = &size->metrics;


      error = sfnt->load_strike_metrics( ttface,
                                         strike_index,
                                         size_metrics );
      if ( error )
        ttsize->strike_index = 0xFFFFFFFFUL;
    }

    return error;
  }